

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int generate_by_wrapper_v(uchar *script,size_t script_len,size_t *write_len)

{
  ulong uVar1;
  byte bVar2;
  size_t sVar3;
  uchar uVar4;
  
  sVar3 = *write_len;
  if (sVar3 == 0) {
    return -2;
  }
  bVar2 = script[sVar3 - 1];
  if (bVar2 < 0xac) {
    if (bVar2 == 0x87) {
      uVar4 = 0x88;
    }
    else {
      if (bVar2 != 0x9c) {
LAB_0010b777:
        uVar1 = sVar3 + 1;
        if (script_len < uVar1) {
          return -2;
        }
        script[sVar3] = 'i';
        *write_len = uVar1;
        if (uVar1 < 0x2711) {
          return 0;
        }
        return -2;
      }
      uVar4 = 0x9d;
    }
  }
  else if (bVar2 == 0xac) {
    uVar4 = 0xad;
  }
  else {
    if (bVar2 != 0xae) goto LAB_0010b777;
    uVar4 = 0xaf;
  }
  script[sVar3 - 1] = uVar4;
  return 0;
}

Assistant:

static int generate_by_wrapper_v(
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    size_t used_len = *write_len;
    if (!used_len)
        return WALLY_EINVAL;

    if (script[used_len - 1] == OP_EQUAL) {
        script[used_len - 1] = OP_EQUALVERIFY;
    } else if (script[used_len - 1] == OP_NUMEQUAL) {
        script[used_len - 1] = OP_NUMEQUALVERIFY;
    } else if (script[used_len - 1] == OP_CHECKSIG) {
        script[used_len - 1] = OP_CHECKSIGVERIFY;
    } else if (script[used_len - 1] == OP_CHECKMULTISIG) {
        script[used_len - 1] = OP_CHECKMULTISIGVERIFY;
    } else if ((used_len + 1) > script_len) {
        return WALLY_EINVAL;
    } else {
        script[used_len] = OP_VERIFY;
        *write_len = used_len + 1;
        if (*write_len > DESCRIPTOR_WITNESS_SCRIPT_MAX_SIZE)
            return WALLY_EINVAL;
    }
    return WALLY_OK;
}